

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_executor.hpp
# Opt level: O3

void __thiscall
asio::execution::detail::any_executor_base::any_executor_base
          (any_executor_base *this,any_executor_base *other)

{
  if (other->target_ == (void *)0x0) {
    this->object_fns_ = (object_fns *)0x0;
    this->target_ = (void *)0x0;
    this->target_fns_ = (target_fns *)0x0;
  }
  else {
    this->object_fns_ = other->object_fns_;
    this->target_fns_ = other->target_fns_;
    other->object_fns_ = (object_fns *)0x0;
    other->target_fns_ = (target_fns *)0x0;
    (*this->object_fns_->move)(this,other);
    other->target_ = (void *)0x0;
  }
  return;
}

Assistant:

any_executor_base(any_executor_base&& other) noexcept
  {
    if (other.target_)
    {
      object_fns_ = other.object_fns_;
      target_fns_ = other.target_fns_;
      other.object_fns_ = 0;
      other.target_fns_ = 0;
      object_fns_->move(*this, other);
      other.target_ = 0;
    }
    else
    {
      object_fns_ = 0;
      target_ = 0;
      target_fns_ = 0;
    }
  }